

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O1

FreePageEntry * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::ZeroPageQueue::PopZeroPageEntry(ZeroPageQueue *this)

{
  CriticalSection *this_00;
  FreePageEntry *pFVar1;
  
  this_00 = &(this->super_BackgroundPageQueue).backgroundPageQueueCriticalSection;
  CCLock::Enter(&this_00->super_CCLock);
  pFVar1 = this->pendingZeroPageList;
  if (pFVar1 != (FreePageEntry *)0x0) {
    this->pendingZeroPageList = pFVar1->Next;
  }
  CCLock::Leave(&this_00->super_CCLock);
  return pFVar1;
}

Assistant:

FreePageEntry* PopZeroPageEntry()
        {
#if SUPPORT_WIN32_SLIST
            return (FreePageEntry *)::InterlockedPopEntrySList(&pendingZeroPageList);
#else
            AutoCriticalSection autoCS(&this->backgroundPageQueueCriticalSection);
            FreePageEntry* head = pendingZeroPageList;
            if (head)
            {
                pendingZeroPageList = pendingZeroPageList->Next;
            }
            return head;
#endif
        }